

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
* detail::
  deserialize_helper<std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  ::apply(vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          *__return_storage_ptr__,const_iterator *begin,const_iterator end)

{
  unsigned_long __n;
  long lVar1;
  bool bVar2;
  _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  _Stack_48;
  
  __n = deserialize_helper<unsigned_long>::apply(begin,end);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector(__return_storage_ptr__,__n,(allocator_type *)&_Stack_48);
  lVar1 = 0;
  while (bVar2 = __n != 0, __n = __n - 1, bVar2) {
    deserialize_helper<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::apply((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)&_Stack_48,begin,end);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    _M_move_assign((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    *)((long)&(((__return_storage_ptr__->
                                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              )._M_impl.super__Vector_impl_data + lVar1),&_Stack_48);
    std::
    _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~_Vector_base(&_Stack_48);
    lVar1 = lVar1 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> apply(StreamType::const_iterator& begin,
                                    StreamType::const_iterator end)
        {
            // retrieve the number of elements
            size_t size = deserialize_helper<size_t>::apply(begin, end);

            std::vector<T> vect(size);
            for (size_t i = 0; i < size; ++i)
            {
                vect[i] = std::move(deserialize_helper<T>::apply(begin, end));
            }
            return vect;
        }